

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall ON_Interval::Length(ON_Interval *this)

{
  double local_20;
  ON_Interval *this_local;
  
  if ((((this->m_t[0] <= -1.23432101234321e+308) ||
       (1.23432101234321e+308 < this->m_t[0] || this->m_t[0] == 1.23432101234321e+308)) ||
      (this->m_t[1] <= -1.23432101234321e+308)) ||
     (1.23432101234321e+308 < this->m_t[1] || this->m_t[1] == 1.23432101234321e+308)) {
    local_20 = 0.0;
  }
  else {
    local_20 = this->m_t[1] - this->m_t[0];
  }
  return local_20;
}

Assistant:

double
ON_Interval::Length() const
{
  return ( ON_IS_VALID(m_t[0]) && ON_IS_VALID(m_t[1]) ) ? m_t[1]-m_t[0] : 0.0;
}